

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int act_cci(nt_opts *opts)

{
  int iVar1;
  nifti_image *nim_00;
  size_t sVar2;
  int local_24;
  int c;
  nifti_image *nim;
  nt_opts *opts_local;
  
  if (2 < g_debug) {
    fprintf(_stderr,"-d collapsing file info from \'%s\' to \'%s\'\n",*(opts->infiles).list,
            opts->prefix);
  }
  if (opts->prefix == (char *)0x0) {
    fprintf(_stderr,"** error: -prefix is required with -cci function\n");
    opts_local._4_4_ = 1;
  }
  else if ((opts->infiles).len < 2) {
    nim_00 = nt_image_read(opts,*(opts->infiles).list,0);
    if (nim_00 == (nifti_image *)0x0) {
      opts_local._4_4_ = 1;
    }
    else {
      nim_00->data = (void *)0x0;
      iVar1 = nifti_read_collapsed_image(nim_00,opts->ci_dims,&nim_00->data);
      if (iVar1 < 0) {
        nifti_image_free(nim_00);
        opts_local._4_4_ = 1;
      }
      else {
        if (opts->keep_hist != 0) {
          sVar2 = strlen(opts->command);
          iVar1 = nifti_add_extension(nim_00,opts->command,(int)sVar2,6);
          if (iVar1 != 0) {
            fprintf(_stderr,"** failed to add command to image as extension\n");
          }
        }
        iVar1 = nifti_set_filenames(nim_00,opts->prefix,1,1);
        if (iVar1 == 0) {
          for (local_24 = 1; local_24 < 8; local_24 = local_24 + 1) {
            if (-1 < opts->ci_dims[local_24]) {
              nim_00->dim[local_24] = 1;
            }
          }
          nifti_update_dims_from_array(nim_00);
          if (2 < g_debug) {
            disp_field("new nim:\n",g_nim_fields,nim_00,0x3f,1);
          }
          iVar1 = nifti_nim_is_valid(nim_00,g_debug);
          if (iVar1 != 0) {
            nifti_image_write(nim_00);
          }
          nifti_image_free(nim_00);
          opts_local._4_4_ = 0;
        }
        else {
          fprintf(_stderr,"** failed to set names, prefix = \'%s\'\n",opts->prefix);
          nifti_image_free(nim_00);
          opts_local._4_4_ = 1;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"** sorry, at the moment -cci allows only 1 input\n");
    opts_local._4_4_ = 1;
  }
  return opts_local._4_4_;
}

Assistant:

int act_cci( nt_opts * opts )
{
   nifti_image      * nim;
   int                c;

   if( g_debug > 2 )
      fprintf(stderr,"-d collapsing file info from '%s' to '%s'\n",
              opts->infiles.list[0], opts->prefix);

   /* sanity checks */
   if( ! opts->prefix ) {
      fprintf(stderr,"** error: -prefix is required with -cci function\n");
      return 1;
   } else if( opts->infiles.len > 1 ) {
      fprintf(stderr,"** sorry, at the moment -cci allows only 1 input\n");
      return 1;
   }

   nim = nt_image_read(opts, opts->infiles.list[0], 0);
   if( !nim ) return 1;
   nim->data = NULL;    /* just to be sure */

   if( nifti_read_collapsed_image(nim, opts->ci_dims, &nim->data) < 0 )
   {
      nifti_image_free(nim);
      return 1;
   }

   /* add command as COMMENT extension */
   if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                          strlen(opts->command), NIFTI_ECODE_COMMENT) )
      fprintf(stderr,"** failed to add command to image as extension\n");

   /* replace filenames using prefix */
   if( nifti_set_filenames(nim, opts->prefix, 1, 1) )
   {
      fprintf(stderr,"** failed to set names, prefix = '%s'\n",opts->prefix);
      nifti_image_free(nim);
      return 1;
   }

   for( c = 1; c < 8; c++ )  /* nuke any collapsed dimension */
      if( opts->ci_dims[c] >= 0 ) nim->dim[c] = 1;

   nifti_update_dims_from_array(nim);

   if(g_debug>2) disp_field("new nim:\n",g_nim_fields,nim,NT_NIM_NUM_FIELDS,1);

   /* and finally, write out results */
   if( nifti_nim_is_valid(nim, g_debug) ) nifti_image_write(nim);

   nifti_image_free(nim);

   return 0;
}